

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insert
          (NumberStringBuilder *this,int32_t index,UnicodeString *unistr,Field field,
          UErrorCode *status)

{
  short sVar1;
  int end;
  int32_t iVar2;
  char16_t *pcVar3;
  
  sVar1 = (unistr->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    end = (unistr->fUnion).fFields.fLength;
  }
  else {
    end = (int)sVar1 >> 5;
  }
  if (end != 0) {
    if (end == 1) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar3 = (unistr->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (unistr->fUnion).fStackFields.fBuffer;
      }
      iVar2 = insertCodePoint(this,index,(uint)(ushort)*pcVar3,field,status);
      return iVar2;
    }
    end = insert(this,index,unistr,0,end,field,status);
  }
  return end;
}

Assistant:

int32_t NumberStringBuilder::insert(int32_t index, const UnicodeString &unistr, Field field,
                                    UErrorCode &status) {
    if (unistr.length() == 0) {
        // Nothing to insert.
        return 0;
    } else if (unistr.length() == 1) {
        // Fast path: insert using insertCodePoint.
        return insertCodePoint(index, unistr.charAt(0), field, status);
    } else {
        return insert(index, unistr, 0, unistr.length(), field, status);
    }
}